

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

uint luaS_hashlongstr(TString *ts)

{
  uint uVar1;
  TString *ts_local;
  
  if (ts->extra == '\0') {
    uVar1 = luaS_hash((char *)(ts + 1),(ts->u).lnglen,ts->hash);
    ts->hash = uVar1;
    ts->extra = '\x01';
  }
  return ts->hash;
}

Assistant:

unsigned int luaS_hashlongstr(TString *ts) {
    lua_assert(ts->tt == LUA_TLNGSTR);
    if (ts->extra == 0) {  /* no hash? */
        ts->hash = luaS_hash(getstr(ts), ts->u.lnglen, ts->hash);
        ts->extra = 1;  /* now it has its hash */
    }
    return ts->hash;
}